

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
SetStringRaw(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,StringRefType *s,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  bool bVar1;
  Ch *pCVar2;
  GenericStringRef *in_RSI;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_RDI;
  Ch *str;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_30;
  
  bVar1 = ShortString::Usable(*(SizeType *)(in_RSI + 8));
  if (bVar1) {
    *(undefined2 *)((long)&in_RDI->baseAllocator_ + 6) = 0x1c05;
    ShortString::SetLength((ShortString *)in_RDI,*(SizeType *)(in_RSI + 8));
    pCVar2 = GenericStringRef::operator_cast_to_char_(in_RSI);
    memmove(in_RDI,pCVar2,(ulong)*(uint *)(in_RSI + 8));
    local_30 = in_RDI;
  }
  else {
    *(undefined2 *)((long)&in_RDI->baseAllocator_ + 6) = 0xc05;
    *(undefined4 *)&in_RDI->chunk_capacity_ = *(undefined4 *)(in_RSI + 8);
    local_30 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
               MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc(in_RDI,(size_t)in_RSI);
    in_RDI->baseAllocator_ =
         (CrtAllocator *)((ulong)in_RDI->baseAllocator_ & 0xffff000000000000 | (ulong)local_30);
    pCVar2 = GenericStringRef::operator_cast_to_char_(in_RSI);
    memcpy(local_30,pCVar2,(ulong)*(uint *)(in_RSI + 8));
  }
  *(undefined1 *)((long)&local_30->chunk_capacity_ + (ulong)*(uint *)(in_RSI + 8)) = 0;
  return;
}

Assistant:

void SetStringRaw(StringRefType s, Allocator& allocator) {
        Ch* str = 0;
        if (ShortString::Usable(s.length)) {
            data_.f.flags = kShortStringFlag;
            data_.ss.SetLength(s.length);
            str = data_.ss.str;
            std::memmove(str, s, s.length * sizeof(Ch));
        } else {
            data_.f.flags = kCopyStringFlag;
            data_.s.length = s.length;
            str = static_cast<Ch *>(allocator.Malloc((s.length + 1) * sizeof(Ch)));
            SetStringPointer(str);
            std::memcpy(str, s, s.length * sizeof(Ch));
        }
        str[s.length] = '\0';
    }